

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

BOOL Js::JavascriptObject::DefineOwnPropertyHelper
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               ScriptContext *scriptContext,bool throwOnError)

{
  bool bVar1;
  TypeId TVar2;
  Type *pTVar3;
  JavascriptArray *arr;
  TypedArrayBase *typedArray;
  JavascriptLibrary *pJVar4;
  ObjectPrototypeObject *this;
  JavascriptFunction *pJVar5;
  Type *pTVar6;
  Type *oldType;
  BOOL returnValue;
  bool throwOnError_local;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *descriptor_local;
  PropertyId propId_local;
  RecyclableObject *obj_local;
  
  (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x36])
            (obj,(ulong)(uint)propId,descriptor);
  pTVar3 = RecyclableObject::GetType(obj);
  RecyclableObject::ClearWritableDataOnlyDetectionBit(obj);
  TVar2 = RecyclableObject::GetTypeId(obj);
  if (TVar2 == TypeIds_HostDispatch) {
    oldType._0_4_ = Js::JavascriptOperators::SetPropertyDescriptor(obj,propId,descriptor);
  }
  else {
    bVar1 = DynamicObject::IsAnyArray(obj);
    if (bVar1) {
      arr = Js::JavascriptArray::FromAnyArray(obj);
      oldType._0_4_ =
           Js::JavascriptOperators::DefineOwnPropertyForArray
                     (arr,propId,descriptor,throwOnError,scriptContext);
    }
    else {
      bVar1 = DynamicObject::IsAnyTypedArray(obj);
      if (bVar1) {
        typedArray = VarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
        oldType._0_4_ =
             Js::JavascriptOperators::DefineOwnPropertyForTypedArray
                       (typedArray,propId,descriptor,throwOnError,scriptContext);
      }
      else {
        oldType._0_4_ =
             Js::JavascriptOperators::DefineOwnPropertyDescriptor
                       (obj,propId,descriptor,throwOnError,scriptContext,
                        PropertyOperation_StrictMode);
        if (propId == 0x1eb) {
          pJVar4 = ScriptContext::GetLibrary(scriptContext);
          this = JavascriptLibraryBase::GetObjectPrototypeObject
                           (&pJVar4->super_JavascriptLibraryBase);
          ObjectPrototypeObject::PostDefineOwnProperty__proto__(this,obj);
        }
      }
    }
  }
  if (propId == 0x19) {
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJVar5 = JavascriptLibraryBase::GetArrayConstructor(&pJVar4->super_JavascriptLibraryBase);
    if ((JavascriptFunction *)obj == pJVar5) {
      pJVar4 = ScriptContext::GetLibrary(scriptContext);
      JavascriptLibrary::SetArrayObjectHasUserDefinedSpecies(pJVar4,true);
    }
  }
  bVar1 = RecyclableObject::IsWritableDataOnlyDetectionBitSet(obj);
  if ((bVar1) && (pTVar6 = RecyclableObject::GetType(obj), pTVar6 == pTVar3)) {
    pTVar3 = RecyclableObject::GetType(obj);
    ScriptContext::InvalidatePropertyStringAndSymbolCaches(scriptContext,propId,pTVar3);
  }
  bVar1 = PropertyDescriptor::IsAccessorDescriptor(descriptor);
  if (bVar1) {
    ScriptContextOptimizationOverrideInfo::SetSideEffects
              (&scriptContext->optimizationOverrides,SideEffects_Accessor);
  }
  return (BOOL)oldType;
}

Assistant:

BOOL JavascriptObject::DefineOwnPropertyHelper(RecyclableObject* obj, PropertyId propId, const PropertyDescriptor& descriptor, ScriptContext* scriptContext, bool throwOnError /* = true*/)
{
    BOOL returnValue;
    obj->ThrowIfCannotDefineProperty(propId, descriptor);

    const Type* oldType = obj->GetType();
    obj->ClearWritableDataOnlyDetectionBit();

    // HostDispatch: it doesn't support changing property attributes and default attributes are not per ES5,
    // so there is no benefit in using ES5 DefineOwnPropertyDescriptor for it, use old implementation.
    if (TypeIds_HostDispatch != obj->GetTypeId())
    {
        // for Array Exotic Objects
        if (DynamicObject::IsAnyArray(obj))
        {
            returnValue = JavascriptOperators::DefineOwnPropertyForArray(
                JavascriptArray::FromAnyArray(obj), propId, descriptor, throwOnError, scriptContext);
        }
        // for Integer Indexed Exotic Objects
        else if (DynamicObject::IsAnyTypedArray(obj))
        {
            returnValue = JavascriptOperators::DefineOwnPropertyForTypedArray(
                VarTo<TypedArrayBase>(obj), propId, descriptor, throwOnError, scriptContext);
        }
        // TODO: implement DefineOwnProperty for other object built-in exotic types.
        else
        {
            returnValue = JavascriptOperators::DefineOwnPropertyDescriptor(obj, propId, descriptor, throwOnError, scriptContext, Js::PropertyOperation_StrictMode);
            if (propId == PropertyIds::__proto__)
            {
                scriptContext->GetLibrary()->GetObjectPrototypeObject()->PostDefineOwnProperty__proto__(obj);
            }
        }
    }
    else
    {
        returnValue = JavascriptOperators::SetPropertyDescriptor(obj, propId, descriptor);
    }

    if (propId == PropertyIds::_symbolSpecies && obj == scriptContext->GetLibrary()->GetArrayConstructor())
    {
        scriptContext->GetLibrary()->SetArrayObjectHasUserDefinedSpecies(true);
    }

    if (obj->IsWritableDataOnlyDetectionBitSet())
    {
        if (obj->GetType() == oldType)
        {
            // Also, if the object's type has not changed, we need to ensure that
            // the cached property string for this property, if any, does not
            // specify this object's type.
            scriptContext->InvalidatePropertyStringAndSymbolCaches(propId, obj->GetType());
        }
    }

    if (descriptor.IsAccessorDescriptor())
    {
        scriptContext->optimizationOverrides.SetSideEffects(Js::SideEffects_Accessor);
    }
    return returnValue;
}